

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O2

ptr<cluster_config> __thiscall raft_functional_common::TestMgr::load_config(TestMgr *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  ptr<cluster_config> pVar1;
  
  std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x50));
  pVar1.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<cluster_config>)
         pVar1.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<cluster_config> load_config() {
        return savedConfig;
    }